

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsp_helper.c
# Opt level: O0

int32_t mipsdsp_sat16_mul_q15_q15(uint16_t a,uint16_t b,CPUMIPSState_conflict5 *env)

{
  undefined4 local_1c;
  int32_t temp;
  CPUMIPSState_conflict5 *env_local;
  uint16_t b_local;
  uint16_t a_local;
  
  if ((a == 0x8000) && (b == 0x8000)) {
    local_1c = 0x7fff0000;
    set_DSPControl_overflow_flag(1,0x15,env);
  }
  else {
    local_1c = (int)(short)a * (int)(short)b * 2;
  }
  return local_1c >> 0x10 & 0xffff;
}

Assistant:

static inline int32_t mipsdsp_sat16_mul_q15_q15(uint16_t a, uint16_t b,
                                                CPUMIPSState *env)
{
    int32_t temp;

    if ((a == 0x8000) && (b == 0x8000)) {
        temp = 0x7FFF0000;
        set_DSPControl_overflow_flag(1, 21, env);
    } else {
        temp = (int16_t)a * (int16_t)b;
        temp = temp << 1;
    }

    return (temp >> 16) & 0x0000FFFF;
}